

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DearchiverVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DearchiverVkImpl> *this,DearchiverVkImpl *pObj)

{
  DearchiverVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::DearchiverVkImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (DearchiverVkImpl *)0x0) {
    RefCountedObject<Diligent::IDearchiver>::AddRef
              ((RefCountedObject<Diligent::IDearchiver> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }